

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * Pathie::Path::mktmpdir(Path *__return_storage_ptr__,string *name)

{
  __mode_t __mode;
  string *this;
  string nstr;
  string local_70;
  string local_50;
  Path local_30;
  
  temp_dir();
  make_tempname(&local_50,name);
  Path(&local_30,&local_50);
  this = &local_70;
  operator/(__return_storage_ptr__,(Path *)this,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  mkdir(__return_storage_ptr__,(char *)this,__mode);
  utf8_to_filename(&local_70,&__return_storage_ptr__->m_path);
  chmod(local_70._M_dataplus._M_p,0x1c0);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Path Path::mktmpdir(const std::string& name /* = "tmpd" */)
{
  Path tmp = Path::temp_dir() / Path(make_tempname(name));
  tmp.mkdir();

#ifdef _PATHIE_UNIX
  std::string nstr = tmp.native();
  chmod(nstr.c_str(), S_IRWXU); // Silently ignore failure of setting file permissions
#endif
  // TODO: How to do that on Windows?

  return tmp;
}